

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,string *internalDependsFileName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  byte bVar1;
  bool bVar2;
  long *plVar3;
  undefined7 extraout_var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  ostream *poVar5;
  size_t __n;
  byte *__src;
  undefined8 unaff_R13;
  undefined8 uVar6;
  ulong uVar7;
  int result;
  string dependee;
  string depender;
  ostringstream msg;
  int local_234;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_230;
  ulong local_228;
  undefined8 local_220;
  string *local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *local_210;
  value_type local_208;
  string local_1e8;
  string local_1c8;
  key_type local_1a8 [11];
  
  uVar7 = 0;
  pvVar4 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
  uVar6 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  local_218 = internalDependsFileName;
  local_210 = &validDeps->_M_t;
  do {
    while( true ) {
      __src = (byte *)this->Dependee;
      do {
        plVar3 = (long *)std::istream::getline((char *)internalDepends,(long)__src);
        if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
          return (bool)((byte)uVar6 & 1);
        }
        __src = (byte *)this->Dependee;
        bVar1 = *__src;
      } while (((ulong)bVar1 < 0x24) && ((0x800002001U >> ((ulong)bVar1 & 0x3f) & 1) != 0));
      __n = *(size_t *)(internalDepends + 8);
      if (__src[__n - 2] == 0xd) {
        __src[__n - 2] = 0;
        __n = __n - 1;
        __src = (byte *)this->Dependee;
        bVar1 = *__src;
      }
      local_228 = uVar7;
      local_220 = uVar6;
      if (bVar1 == 0x20) break;
      memcpy(this->Depender,__src,__n);
      bVar2 = cmsys::SystemTools::FileExists(this->Depender);
      uVar7 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,this->Depender,(allocator<char> *)&local_208);
      pvVar4 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                              *)local_210,local_1a8)->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      std::__cxx11::string::~string((string *)local_1a8);
      uVar6 = local_220;
    }
    local_230 = pvVar4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,(char *)(__src + 1),(allocator<char> *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,this->Depender,(allocator<char> *)local_1a8);
    if (local_230 !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_230,&local_208);
    }
    bVar2 = cmsys::SystemTools::FileExists(&local_208);
    if (bVar2) {
      if ((local_228 & 1) == 0) {
        local_234 = 0;
        bVar2 = cmFileTimeCache::Compare(this->FileTimeCache,local_218,&local_208,&local_234);
        uVar7 = local_228;
        if (!bVar2 || local_234 < 0) {
          if (this->Verbose == true) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar5 = std::operator<<((ostream *)local_1a8,"Dependee \"");
            poVar5 = std::operator<<(poVar5,(string *)&local_208);
            poVar5 = std::operator<<(poVar5,"\" is newer than depends file \"");
            poVar5 = std::operator<<(poVar5,(string *)local_218);
            poVar5 = std::operator<<(poVar5,"\".");
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(&local_1e8);
            goto LAB_00345eb4;
          }
          goto LAB_00345ec4;
        }
      }
      else {
        local_234 = 0;
        bVar2 = cmFileTimeCache::Compare(this->FileTimeCache,&local_1c8,&local_208,&local_234);
        uVar7 = local_228;
        if (!bVar2 || local_234 < 0) {
          if (this->Verbose == true) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            poVar5 = std::operator<<((ostream *)local_1a8,"Dependee \"");
            poVar5 = std::operator<<(poVar5,(string *)&local_208);
            poVar5 = std::operator<<(poVar5,"\" is newer than depender \"");
            poVar5 = std::operator<<(poVar5,(string *)&local_1c8);
            poVar5 = std::operator<<(poVar5,"\".");
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(&local_1e8);
            goto LAB_00345eb4;
          }
          goto LAB_00345ec4;
        }
      }
    }
    else {
      if (this->Verbose == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar5 = std::operator<<((ostream *)local_1a8,"Dependee \"");
        poVar5 = std::operator<<(poVar5,(string *)&local_208);
        poVar5 = std::operator<<(poVar5,"\" does not exist for depender \"");
        poVar5 = std::operator<<(poVar5,(string *)&local_1c8);
        poVar5 = std::operator<<(poVar5,"\".");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        cmSystemTools::Stdout(&local_1e8);
LAB_00345eb4:
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      }
LAB_00345ec4:
      if (local_230 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,this->Depender,(allocator<char> *)&local_1e8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
        ::erase(local_210,local_1a8);
        std::__cxx11::string::~string((string *)local_1a8);
      }
      uVar7 = local_228;
      if ((local_228 & 1) != 0) {
        cmsys::SystemTools::RemoveFile(&local_1c8);
        uVar7 = 0;
      }
      local_220 = 0;
      local_230 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0;
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_208);
    pvVar4 = local_230;
    uVar6 = local_220;
  } while( true );
}

Assistant:

bool cmDepends::CheckDependencies(
  std::istream& internalDepends, const std::string& internalDependsFileName,
  std::map<std::string, DependencyVector>& validDeps)
{
  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;
  DependencyVector* currentDependencies = nullptr;

  while (internalDepends.getline(this->Dependee, this->MaxPath)) {
    if (this->Dependee[0] == 0 || this->Dependee[0] == '#' ||
        this->Dependee[0] == '\r') {
      continue;
    }
    size_t len = internalDepends.gcount() - 1;
    if (this->Dependee[len - 1] == '\r') {
      len--;
      this->Dependee[len] = 0;
    }
    if (this->Dependee[0] != ' ') {
      memcpy(this->Depender, this->Dependee, len + 1);
      // Calling FileExists() for the depender here saves in many cases 50%
      // of the calls to FileExists() further down in the loop. E.g. for
      // kdelibs/khtml this reduces the number of calls from 184k down to 92k,
      // or the time for cmake -E cmake_depends from 0.3 s down to 0.21 s.
      dependerExists = cmSystemTools::FileExists(this->Depender);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[this->Depender];
      continue;
    }
    /*
    // Parse the dependency line.
    if(!this->ParseDependency(line.c_str()))
      {
      continue;
      }
      */

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    const std::string dependee(this->Dependee + 1);
    const std::string depender(this->Depender);
    if (currentDependencies != nullptr) {
      currentDependencies->push_back(dependee);
    }

    if (!cmSystemTools::FileExists(dependee)) {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if (this->Verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dependee << "\" does not exist for depender \""
            << depender << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
    } else {
      if (dependerExists) {
        // The dependee and depender both exist.  Compare file times.
        int result = 0;
        if ((!this->FileTimeCache->Compare(depender, dependee, &result) ||
             result < 0)) {
          // The depender is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee << "\" is newer than depender \""
                << depender << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str());
          }
        }
      } else {
        // The dependee exists, but the depender doesn't. Regenerate if the
        // internalDepends file is older than the dependee.
        int result = 0;
        if ((!this->FileTimeCache->Compare(internalDependsFileName, dependee,
                                           &result) ||
             result < 0)) {
          // The depends-file is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depends file \""
                << internalDependsFileName << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str());
          }
        }
      }
    }
    if (regenerate) {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != nullptr) {
        validDeps.erase(this->Depender);
        currentDependencies = nullptr;
      }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists) {
        cmSystemTools::RemoveFile(depender);
        dependerExists = false;
      }
    }
  }

  return okay;
}